

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O1

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  pointer *ppSVar1;
  pointer *ppMVar2;
  pointer *ppMVar3;
  pointer *ppVVar4;
  pointer *ppSVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  double *pdVar6;
  JointType JVar7;
  pointer pFVar8;
  iterator iVar9;
  pointer pcVar10;
  pointer pvVar11;
  pointer pBVar12;
  pointer pBVar13;
  iterator iVar14;
  SpatialVector_t *pSVar15;
  iterator iVar16;
  iterator __position;
  iterator __position_00;
  pointer puVar17;
  iterator __position_01;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  string *__k;
  iterator iVar23;
  mapped_type *pmVar24;
  pointer pJVar25;
  ostream *poVar26;
  RBDLError *pRVar27;
  int *piVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  _Alloc_hider _Var33;
  uint uVar34;
  uint uVar35;
  ActualDstType actualDst;
  int *piVar36;
  uint movable_parent_id;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  SpatialTransform movable_parent_transform;
  SpatialRigidBodyInertia rbi;
  uint local_30c;
  Body *local_308;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_300;
  SpatialTransform *local_2f8;
  string *local_2f0;
  SpatialMatrix_t local_2e8;
  string local_168;
  string local_148;
  SpatialTransform local_128;
  string local_c0;
  string local_a0;
  SpatialRigidBodyInertia local_80;
  
  JVar7 = joint->mJointType;
  local_308 = body;
  if (((JVar7 - JointTypeRevolute < 10) || (JVar7 == JointTypeCustom)) ||
     (JVar7 == JointTypeHelical)) {
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = 1.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 1.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[6] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[7] = 0.0;
    local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[8] = 1.0;
    local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    uVar31 = (ulong)(parent_id - this->fixed_body_discriminator);
    local_30c = parent_id;
    if ((parent_id != 0xffffffff && this->fixed_body_discriminator <= parent_id) &&
       (uVar30 = ((long)(this->mFixedBodies).
                        super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        .
                        super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mFixedBodies).
                        super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        .
                        super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
       uVar31 <= uVar30 && uVar30 - uVar31 != 0)) {
      pFVar8 = (this->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_30c = pFVar8[uVar31].mMovableParent;
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pFVar8[uVar31].mParentTransform.E;
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = *(double *)((long)&pFVar8[uVar31].mParentTransform.E + 8);
      pdVar6 = (double *)((long)&pFVar8[uVar31].mParentTransform.E + 0x10);
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = *pdVar6;
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = pdVar6[1];
      pdVar6 = (double *)((long)&pFVar8[uVar31].mParentTransform.E + 0x20);
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = *pdVar6;
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = pdVar6[1];
      pdVar6 = (double *)((long)&pFVar8[uVar31].mParentTransform.E + 0x30);
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = *pdVar6;
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = pdVar6[1];
      local_128.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] = *(double *)((long)&pFVar8[uVar31].mParentTransform.E + 0x40);
      local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] = *(double *)&pFVar8[uVar31].mParentTransform.r.super_Vector3d;
      local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] = *(double *)((long)&pFVar8[uVar31].mParentTransform.r + 8);
      local_128.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] = *(double *)((long)&pFVar8[uVar31].mParentTransform.r + 0x10);
    }
    iVar9._M_current =
         (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_2f8 = joint_frame;
    if (iVar9._M_current ==
        (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar9,&local_30c);
    }
    else {
      *iVar9._M_current = local_30c;
      (this->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    pJVar25 = (this->mJoints).
              super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              .
              super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar34 = pJVar25[-1].q_index;
    if ((pJVar25[-1].mDoFCount == 0) || (pJVar25[-1].mJointType == JointTypeCustom)) {
      if (pJVar25[-1].mJointType == JointTypeCustom) {
        uVar34 = uVar34 + *(int *)((this->mCustomJoints).
                                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1] + 8);
      }
    }
    else {
      uVar34 = pJVar25[-1].mDoFCount + uVar34;
    }
    local_2f0 = body_name;
    if (joint->mDoFCount != 0) {
      uVar35 = 0;
      do {
        local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)CONCAT44(local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0]._4_4_,uVar35 + uVar34);
        iVar9._M_current =
             (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->lambda_q,iVar9,(uint *)&local_2e8);
        }
        else {
          *iVar9._M_current = uVar35 + uVar34;
          (this->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 < joint->mDoFCount);
    }
    local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
    local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
    local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&this->mu,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2e8);
    if ((void *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0] != (void *)0x0) {
      operator_delete((void *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0],
                      (long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[2] -
                      (long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0]);
    }
    uVar30 = (ulong)local_30c;
    pvVar11 = (this->mu).
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar31 = ((long)(this->mu).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
             -0x5555555555555555;
    if (uVar31 < uVar30 || uVar31 - uVar30 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    else {
      this_00 = pvVar11 + uVar30;
      uVar34 = (int)((ulong)((long)(this->mBodies).
                                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                   .
                                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mBodies).
                                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                  .
                                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)CONCAT44(local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[0]._4_4_,uVar34);
      iVar9._M_current =
           (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar9,(uint *)&local_2e8);
      }
      else {
        *iVar9._M_current = uVar34;
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_lambda).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_2e8);
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_base).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_2e8);
      std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
      push_back(&(this->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                ,local_308);
      __k = local_2f0;
      if (local_2f0->_M_string_length != 0) {
        iVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mBodyNameMap)._M_t,local_2f0);
        if ((_Rb_tree_header *)iVar23._M_node !=
            &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2e8,"Error: Body with name \'",0x17);
          poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_2e8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\' already exists!",0x11);
          std::endl<char,std::char_traits<char>>(poVar26);
          pRVar27 = (RBDLError *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          Errors::RBDLError::RBDLError(pRVar27,&local_a0);
          __cxa_throw(pRVar27,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
        }
        pBVar12 = (this->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar13 = (this->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pmVar24 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](&this->mBodyNameMap,__k);
        *pmVar24 = (int)((ulong)((long)pBVar12 - (long)pBVar13) >> 4) * -0x49249249 - 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->v).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->a).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->a).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      uVar34 = (int)((ulong)((long)(this->mJoints).
                                   super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   .
                                   super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mJoints).
                                  super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  .
                                  super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1
      ;
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      push_back(&(this->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ,joint);
      pJVar25 = (this->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->mJoints).
      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>.
      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].q_index =
           pJVar25[uVar34].mDoFCount + pJVar25[uVar34].q_index;
      pSVar15 = joint->mJointAxes;
      iVar14._M_current =
           (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
        _M_realloc_insert<SpatialVector_t_const&>
                  ((vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->S,
                   iVar14,pSVar15);
      }
      else {
        dVar18 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
        dVar19 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
        dVar20 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
        dVar21 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        dVar22 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             dVar22;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             dVar20;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             dVar21;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             dVar18;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             dVar19;
        ppSVar1 = &(this->S).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 1.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0
      ;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_J).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_2e8);
      pSVar15 = joint->mJointAxes;
      iVar14._M_current =
           (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>>::
        _M_realloc_insert<SpatialVector_t_const&>
                  ((vector<SpatialVector_t,Eigen::aligned_allocator<SpatialVector_t>> *)&this->v_J,
                   iVar14,pSVar15);
      }
      else {
        dVar18 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
        dVar19 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [1];
        dVar20 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [2];
        dVar21 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
        dVar22 = (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             (pSVar15->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             dVar22;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             dVar20;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             dVar21;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             dVar18;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             dVar19;
        ppSVar1 = &(this->v_J).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->c_J).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->c_J).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      memset(&local_2e8,0,0x90);
      iVar16._M_current =
           (this->multdof3_S).
           super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          (this->multdof3_S).
          super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
                  ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                    *)&this->multdof3_S,iVar16,(Matrix<double,_6,_3,_0,_6,_3> *)&local_2e8);
      }
      else {
        memset(iVar16._M_current,0,0x90);
        ppMVar2 = &(this->multdof3_S).
                   super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      memset(&local_2e8,0,0x90);
      iVar16._M_current =
           (this->multdof3_U).
           super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar16._M_current ==
          (this->multdof3_U).
          super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,6,3,0,6,3>>
                  ((vector<Eigen::Matrix<double,6,3,0,6,3>,Eigen::aligned_allocator<Eigen::Matrix<double,6,3,0,6,3>>>
                    *)&this->multdof3_U,iVar16,(Matrix<double,_6,_3,_0,_6,_3> *)&local_2e8);
      }
      else {
        memset(iVar16._M_current,0,0x90);
        ppMVar2 = &(this->multdof3_U).
                   super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 0.0;
      __position._M_current =
           (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::_M_realloc_insert<Matrix3_t>
                  (&this->multdof3_Dinv,__position,(Matrix3_t *)&local_2e8);
      }
      else {
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0
        ;
        ((__position._M_current)->super_Matrix3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0
        ;
        ppMVar3 = &(this->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar3 = *ppMVar3 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      __position_00._M_current =
           (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_realloc_insert<Vector3_t>
                  (&this->multdof3_u,__position_00,(Vector3_t *)&local_2e8);
      }
      else {
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ((__position_00._M_current)->super_Vector3d).
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ppVVar4 = &(this->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppVVar4 = *ppVVar4 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)((ulong)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[0] & 0xffffffff00000000);
      iVar9._M_current =
           (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->multdof3_w_index,iVar9,(uint *)&local_2e8);
      }
      else {
        *iVar9._M_current = 0;
        (this->multdof3_w_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      this->dof_count = this->dof_count + joint->mDoFCount;
      pJVar25 = (this->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar31 = ((long)(this->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar25 >> 3) *
               -0x5555555555555555;
      iVar29 = 0;
      if (1 < uVar31) {
        puVar17 = (this->multdof3_w_index).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar29 = 0;
        uVar30 = 1;
        uVar34 = 2;
        do {
          if (pJVar25[uVar30].mJointType == JointTypeSpherical) {
            puVar17[uVar30] = this->dof_count + iVar29;
            iVar29 = iVar29 + 1;
          }
          uVar30 = (ulong)uVar34;
          uVar34 = uVar34 + 1;
        } while (uVar30 <= uVar31 && uVar31 - uVar30 != 0);
      }
      this->q_size = iVar29 + this->dof_count;
      this->qdot_size = this->qdot_size + joint->mDoFCount;
      Math::SpatialTransform::operator*((SpatialTransform *)&local_2e8,local_2f8,&local_128);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::emplace_back<RigidBodyDynamics::Math::SpatialTransform>
                (&(this->X_T).
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ,(SpatialTransform *)&local_2e8);
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->c).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->c).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      memset(&local_2e8,0,0x120);
      __position_01._M_current =
           (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
           super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (this->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
          super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::
        _M_realloc_insert<SpatialMatrix_t>
                  (&(this->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>,
                   __position_01,&local_2e8);
      }
      else {
        memset(__position_01._M_current,0,0x120);
        ppSVar5 = &(this->IA).
                   super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar5 = *ppSVar5 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->pA).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->pA).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->U).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->U).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      lVar32 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if ((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != lVar32) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar32,
                   1);
      }
      lVar32 = (this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (0 < lVar32) {
        memset((this->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,lVar32 << 3);
      }
      lVar32 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if ((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != lVar32) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar32,
                   1);
      }
      lVar32 = (this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (0 < lVar32) {
        memset((this->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data,0,lVar32 << 3);
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->f).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->f).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC
                (&local_80,local_308->mMass,&local_308->mCenterOfMass,&local_308->mInertia);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->Ic).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,&local_80);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::push_back(&(this->I).
                   super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  ,&local_80);
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->hc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->hc).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->hc).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
      local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
      iVar14._M_current =
           (this->hdotc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          (this->hdotc).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::
        _M_realloc_insert<SpatialVector_t>
                  (&(this->hdotc).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,iVar14
                   ,(SpatialVector_t *)&local_2e8);
      }
      else {
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0
        ;
        ((iVar14._M_current)->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0
        ;
        ppSVar1 = &(this->hdotc).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      lVar32 = ((long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      if (lVar32 - (ulong)this->fixed_body_discriminator != 0) {
        this->previously_added_body_id = (int)lVar32 - 1;
        puVar17 = (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar17) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar17;
        }
        local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0
        ;
        local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0
        ;
        local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0
        ;
        pJVar25 = (this->mJoints).
                  super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_finish != pJVar25) {
          uVar31 = 0;
          do {
            local_300.first = pJVar25[uVar31].mJointType;
            local_300.second = (uint)uVar31;
            std::
            vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
            ::emplace_back<std::pair<RigidBodyDynamics::JointType,unsigned_int>>
                      ((vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>
                        *)&local_2e8,&local_300);
            local_300.first =
                 (this->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar31].mJointType;
            iVar9._M_current =
                 (this->mJointUpdateOrder).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (this->mJointUpdateOrder).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(&this->mJointUpdateOrder,iVar9,&local_300.first);
            }
            else {
              *iVar9._M_current = local_300.first;
              (this->mJointUpdateOrder).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            uVar31 = (ulong)((uint)uVar31 + 1);
            pJVar25 = (this->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar30 = ((long)(this->mJoints).
                            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            .
                            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar25 >> 3) *
                     -0x5555555555555555;
          } while (uVar31 <= uVar30 && uVar30 - uVar31 != 0);
        }
        puVar17 = (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mJointUpdateOrder).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar17) {
          (this->mJointUpdateOrder).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar17;
        }
        while (local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1] != local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0]) {
          if (local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0]
              != local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [1]) {
            iVar29 = *(int *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[0];
            piVar36 = (int *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[0];
            do {
              if (*piVar36 == iVar29) {
                iVar9._M_current =
                     (this->mJointUpdateOrder).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (this->mJointUpdateOrder).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                             &this->mJointUpdateOrder,iVar9,(uint *)(piVar36 + 1));
                }
                else {
                  *iVar9._M_current = piVar36[1];
                  (this->mJointUpdateOrder).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                }
                piVar28 = piVar36 + 2;
                if ((piVar28 !=
                     (int *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[1]) &&
                   (lVar32 = (long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[1] - (long)piVar28 >> 3, 0 < lVar32)) {
                  lVar32 = lVar32 + 1;
                  do {
                    *(undefined8 *)(piVar28 + -2) = *(undefined8 *)piVar28;
                    piVar28 = piVar28 + 2;
                    lVar32 = lVar32 + -1;
                  } while (1 < lVar32);
                }
                local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [1] = (double)((long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[1] + -8);
              }
              else {
                piVar36 = piVar36 + 2;
              }
            } while (piVar36 !=
                     (int *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[1]);
          }
        }
        uVar34 = this->previously_added_body_id;
        if ((int *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0] == (int *)0x0) {
          return uVar34;
        }
        operator_delete((void *)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0],
                        (long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] -
                        (long)local_2e8.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0]);
        return uVar34;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2e8,"Error: cannot add more than ",0x1c);
    poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar26,
               " movable bodies. You need to modify Model::fixed_body_discriminator for this.",0x4d)
    ;
    std::endl<char,std::char_traits<char>>(poVar26);
    pRVar27 = (RBDLError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    Errors::RBDLError::RBDLError(pRVar27,&local_c0);
    __cxa_throw(pRVar27,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  if (JVar7 == JointTypeFixed) {
    pcVar10 = (body_name->_M_dataplus)._M_p;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar10,pcVar10 + body_name->_M_string_length);
    uVar34 = AddBodyFixedJoint(this,parent_id,joint_frame,(Joint *)body_name,local_308,&local_148);
    this->previously_added_body_id = uVar34;
    local_168.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
    _Var33._M_p = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0017b5c0;
  }
  else {
    pcVar10 = (body_name->_M_dataplus)._M_p;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar10,pcVar10 + body_name->_M_string_length);
    uVar34 = AddBodyMultiDofJoint(this,parent_id,joint_frame,joint,local_308,&local_168);
    this->previously_added_body_id = uVar34;
    _Var33._M_p = local_168._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) goto LAB_0017b5c0;
  }
  operator_delete(_Var33._M_p,local_168.field_2._M_allocated_capacity + 1);
LAB_0017b5c0:
  return this->previously_added_body_id;
}

Assistant:

unsigned int Model::AddBody(
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  assert (lambda.size() > 0);
  assert (joint.mJointType != JointTypeUndefined);

  if (joint.mJointType == JointTypeFixed) {
    previously_added_body_id = AddBodyFixedJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);

    return previously_added_body_id;
  } else if ( (joint.mJointType == JointTypeSpherical)
              || (joint.mJointType == JointTypeEulerZYX)
              || (joint.mJointType == JointTypeEulerXYZ)
              || (joint.mJointType == JointTypeEulerYXZ)
              || (joint.mJointType == JointTypeTranslationXYZ)
              || (joint.mJointType == JointTypeCustom)
            ) {
    // no action required
  } else if (joint.mJointType != JointTypePrismatic
             && joint.mJointType != JointTypeRevolute
             && joint.mJointType != JointTypeRevoluteX
             && joint.mJointType != JointTypeRevoluteY
             && joint.mJointType != JointTypeRevoluteZ
             && joint.mJointType != JointTypeHelical
            ) {
    previously_added_body_id = AddBodyMultiDofJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);
    return previously_added_body_id;
  }

  // If we add the body to a fixed body we have to make sure that we
  // actually add it to its movable parent.
  unsigned int movable_parent_id = parent_id;
  SpatialTransform movable_parent_transform;

  if (IsFixedBodyId(parent_id)) {
    unsigned int fbody_id = parent_id - fixed_body_discriminator;
    movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
    movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
  }

  // structural information
  lambda.push_back(movable_parent_id);
  unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;

  if (mJoints[mJoints.size() - 1].mDoFCount > 0
      && mJoints[mJoints.size() - 1].mJointType != JointTypeCustom) {
    lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
  } else if (mJoints[mJoints.size() - 1].mJointType == JointTypeCustom) {
    unsigned int custom_index = mJoints[mJoints.size() - 1].custom_joint_index;
    lambda_q_last = lambda_q_last
                    + mCustomJoints[mCustomJoints.size() - 1]->mDoFCount;
  }

  for (unsigned int i = 0; i < joint.mDoFCount; i++) {
    lambda_q.push_back(lambda_q_last + i);
  }
  mu.push_back(std::vector<unsigned int>());
  mu.at(movable_parent_id).push_back(mBodies.size());

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());
  mBodies.push_back(body);

  if (body_name.size() != 0) {
    if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    mBodyNameMap[body_name] = mBodies.size() - 1;
  }

  // state information
  v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  // Joints
  unsigned int prev_joint_index = mJoints.size() - 1;
  mJoints.push_back(joint);

  if (mJoints[prev_joint_index].mJointType != JointTypeCustom) {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  } else {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  }

  S.push_back (joint.mJointAxes[0]);

  // Joint state variables
  X_J.push_back (SpatialTransform());
  v_J.push_back (joint.mJointAxes[0]);
  c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  // workspace for joints with 3 dof
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  dof_count = dof_count + joint.mDoFCount;

  // update the w components of the Quaternions. They are stored at the end
  // of the q vector
  int multdof3_joint_counter = 0;
  int mCustomJoint_joint_counter = 0;
  for (unsigned int i = 1; i < mJoints.size(); i++) {
    if (mJoints[i].mJointType == JointTypeSpherical) {
      multdof3_w_index[i] = dof_count + multdof3_joint_counter;
      multdof3_joint_counter++;
    }
  }

  q_size = dof_count
           + multdof3_joint_counter;

  qdot_size = qdot_size + joint.mDoFCount;

  // we have to invert the transformation as it is later always used from the
  // child bodies perspective.
  X_T.push_back(joint_frame * movable_parent_transform);

  // Dynamic variables
  c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  IA.push_back(SpatialMatrix::Zero());
  pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  d = VectorNd::Zero (mBodies.size());
  u = VectorNd::Zero (mBodies.size());

  f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

  SpatialRigidBodyInertia rbi =
    SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass,
        body.mCenterOfMass,
        body.mInertia);

  Ic.push_back (rbi);
  I.push_back (rbi);
  hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));
  hdotc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  if (mBodies.size() == fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg << "Error: cannot add more than "
             << fixed_body_discriminator
             <<  " movable bodies. You need to modify Model::fixed_body_discriminator for this."
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  previously_added_body_id = mBodies.size() - 1;

  mJointUpdateOrder.clear();

  // update the joint order computation
  std::vector<std::pair<JointType, unsigned int> > joint_types;
  for (unsigned int i = 0; i < mJoints.size(); i++) {
    joint_types.push_back(
      std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
    mJointUpdateOrder.push_back (mJoints[i].mJointType);
  }

  mJointUpdateOrder.clear();
  JointType current_joint_type = JointTypeUndefined;
  while (joint_types.size() != 0) {
    current_joint_type = joint_types[0].first;

    std::vector<std::pair<JointType, unsigned int> >::iterator type_iter =
      joint_types.begin();

    while (type_iter != joint_types.end()) {
      if (type_iter->first == current_joint_type) {
        mJointUpdateOrder.push_back (type_iter->second);
        type_iter = joint_types.erase (type_iter);
      } else {
        ++type_iter;
      }
    }
  }

  //  for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
  //    std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i]
  // << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
  //  }

  return previously_added_body_id;
}